

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

void Saig_ManWindowOutline_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Vec_Ptr_t *vNodes,int *pDists)

{
  Vec_Ptr_t *pVVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (nDist == 0) {
    return;
  }
  while( true ) {
    if (nDist <= pDists[pObj->Id]) {
      return;
    }
    pDists[pObj->Id] = nDist;
    iVar4 = p->nTravIds;
    iVar6 = pObj->TravId;
    pObj->TravId = iVar4;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar3 & 7) != 3) break;
    if ((pObj->field_0).CioId < p->nTruePos) {
      return;
    }
    uVar3 = ((pObj->field_0).CioId - p->nTruePos) + p->nTruePis;
    if (((int)uVar3 < 0) || (p->vCis->nSize <= (int)uVar3)) goto LAB_006cc57d;
    pAVar2 = (Aig_Obj_t *)p->vCis->pArray[uVar3];
    if (pAVar2->TravId != iVar4) {
      Saig_ManWindowOutline_rec(p,pAVar2,nDist,vNodes,pDists);
    }
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
    nDist = nDist + -1;
    if (nDist == 0) {
      return;
    }
  }
  if ((uVar3 & 7) == 1) {
    return;
  }
  if (iVar6 != iVar4) {
    Vec_PtrPush(vNodes,pObj);
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
  }
  if ((uVar3 & 7) == 2) {
    if ((pObj->field_0).CioId < p->nTruePis) {
      return;
    }
    pAVar2 = Saig_ObjLoToLi(p,pObj);
    if (pAVar2->TravId != p->nTravIds) {
      Saig_ManWindowOutline_rec(p,pAVar2,nDist,vNodes,pDists);
    }
    if (p->pFanData == (int *)0x0) {
      __assert_fail("p->pFanData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                    ,0x4e,
                    "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                   );
    }
    if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
      return;
    }
    uVar3 = 0xffffffff;
    uVar7 = 0;
    do {
      if (uVar7 == 0) {
        if (p->nFansAlloc <= pObj->Id) {
LAB_006cc5da:
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar4 = pObj->Id * 5;
      }
      else {
        if (p->nFansAlloc <= (int)uVar3 / 2) {
LAB_006cc5bb:
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar4 = (uVar3 & 1) + ((int)uVar3 >> 1) * 5 + 3;
      }
      pVVar1 = p->vObjs;
      uVar3 = p->pFanData[iVar4];
      if (pVVar1 == (Vec_Ptr_t *)0x0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        uVar5 = (int)uVar3 >> 1;
        if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) {
LAB_006cc57d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar2 = (Aig_Obj_t *)pVVar1->pArray[uVar5];
      }
      Saig_ManWindowOutline_rec(p,pAVar2,nDist + -1,vNodes,pDists);
      uVar7 = uVar7 + 1;
      if (*(uint *)&pObj->field_0x18 >> 6 <= uVar7) {
        return;
      }
    } while( true );
  }
  if ((uVar3 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                  ,0x52,
                  "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  iVar4 = nDist + -1;
  Saig_ManWindowOutline_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iVar4,vNodes,pDists);
  Saig_ManWindowOutline_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),iVar4,vNodes,pDists);
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                  ,0x55,
                  "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) == 0) {
    return;
  }
  uVar3 = 0xffffffff;
  uVar7 = 0;
  do {
    if (uVar7 == 0) {
      if (p->nFansAlloc <= pObj->Id) goto LAB_006cc5da;
      iVar6 = pObj->Id * 5;
    }
    else {
      if (p->nFansAlloc <= (int)uVar3 / 2) goto LAB_006cc5bb;
      iVar6 = (uVar3 & 1) + ((int)uVar3 >> 1) * 5 + 3;
    }
    pVVar1 = p->vObjs;
    uVar3 = p->pFanData[iVar6];
    if (pVVar1 == (Vec_Ptr_t *)0x0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      uVar5 = (int)uVar3 >> 1;
      if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_006cc57d;
      pAVar2 = (Aig_Obj_t *)pVVar1->pArray[uVar5];
    }
    Saig_ManWindowOutline_rec(p,pAVar2,iVar4,vNodes,pDists);
    uVar7 = uVar7 + 1;
    if (*(uint *)&pObj->field_0x18 >> 6 <= uVar7) {
      return;
    }
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of PI/internal nodes.]

  Description [Marks all the visited nodes with the current ID.
  Does not collect constant node and PO/LI nodes.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManWindowOutline_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Vec_Ptr_t * vNodes, int * pDists )
{
    Aig_Obj_t * pMatch, * pFanout;
    int fCollected, iFanout = -1, i;
    if ( nDist == 0 )
        return;
    if ( pDists[pObj->Id] >= nDist )
        return;
    pDists[pObj->Id] = nDist;
    fCollected = Aig_ObjIsTravIdCurrent( p, pObj );
    Aig_ObjSetTravIdCurrent( p, pObj );    
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsPo(p, pObj) )
        return;
    if ( Saig_ObjIsLi(p, pObj) )
    {
        pMatch = Saig_ObjLiToLo( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
        return;
    }
    if ( !fCollected )
        Vec_PtrPush( vNodes, pObj );
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
            Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin1(pObj), nDist-1, vNodes, pDists );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
}